

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obs2icrs.cpp
# Opt level: O3

void PrintResults(CEExecOptions *inputs,CESkyCoord *results)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  string local_70 [2];
  CEAngle local_30 [16];
  
  putchar(10);
  puts("******************************************");
  puts("* Results of Observed -> ICRS conversion *");
  puts("******************************************");
  puts("Observed Coordinates (input)");
  paVar1 = &local_70[0].field_2;
  local_70[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"azimuth","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_70);
  printf("    Azimuth        : %f degrees\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_70[0]._M_dataplus._M_p);
  }
  local_70[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"zenith","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_70);
  printf("    Zenith         : %+f degrees\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_70[0]._M_dataplus._M_p);
  }
  local_70[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"zenith","");
  dVar2 = CLOptions::AsDouble(&inputs->super_CLOptions,local_70);
  printf("    Altitude       : %+f degrees\n",90.0 - dVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_70[0]._M_dataplus._M_p);
  }
  puts("ICRS Coordinates (output)");
  CEDate::CEDate((CEDate *)local_70,2451545.0,JD);
  (**(code **)(*(long *)results + 0x18))(local_30,results,local_70);
  CEAngle::Deg();
  printf("    Right Ascension: %f degrees\n");
  CEAngle::~CEAngle(local_30);
  CEDate::~CEDate((CEDate *)local_70);
  CEDate::CEDate((CEDate *)local_70,2451545.0,JD);
  (**(code **)(*(long *)results + 0x20))(local_30,results,local_70);
  CEAngle::Deg();
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(local_30);
  CEDate::~CEDate((CEDate *)local_70);
  puts("Observer Info");
  local_70[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"juliandate","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_70);
  printf("    Julian Date    : %f\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_70[0]._M_dataplus._M_p);
  }
  local_70[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"longitude","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_70);
  printf("    Longitude      : %f deg\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_70[0]._M_dataplus._M_p);
  }
  local_70[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"latitude","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_70);
  printf("    Latitude       : %+f deg\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_70[0]._M_dataplus._M_p);
  }
  local_70[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"elevation","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_70);
  printf("    Elevation      : %f meters\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_70[0]._M_dataplus._M_p);
  }
  local_70[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"pressure","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_70);
  printf("    Pressure       : %f hPa\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_70[0]._M_dataplus._M_p);
  }
  local_70[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"temperature","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_70);
  printf("    Temperature    : %f Celsius\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_70[0]._M_dataplus._M_p);
  }
  local_70[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"humidity","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_70);
  printf("    Relative Humid.: %f\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_70[0]._M_dataplus._M_p);
  }
  putchar(10);
  return;
}

Assistant:

void PrintResults(CEExecOptions&    inputs, 
                  const CESkyCoord& results)
{
    std::printf("\n") ;
    std::printf("******************************************\n") ;
    std::printf("* Results of Observed -> ICRS conversion *\n") ;
    std::printf("******************************************\n") ;
    std::printf("Observed Coordinates (input)\n") ;
    std::printf("    Azimuth        : %f degrees\n", inputs.AsDouble("azimuth")) ;
    std::printf("    Zenith         : %+f degrees\n", inputs.AsDouble("zenith")) ;
    std::printf("    Altitude       : %+f degrees\n", 90.0-inputs.AsDouble("zenith")) ;
    std::printf("ICRS Coordinates (output)\n") ;
    std::printf("    Right Ascension: %f degrees\n", results.XCoord().Deg()) ;
    std::printf("    Declination    : %+f degrees\n", results.YCoord().Deg()) ;
    std::printf("Observer Info\n") ;
    std::printf("    Julian Date    : %f\n", inputs.AsDouble("juliandate")) ;
    std::printf("    Longitude      : %f deg\n", inputs.AsDouble("longitude")) ;
    std::printf("    Latitude       : %+f deg\n", inputs.AsDouble("latitude")) ;
    std::printf("    Elevation      : %f meters\n", inputs.AsDouble("elevation")) ;
    std::printf("    Pressure       : %f hPa\n", inputs.AsDouble("pressure")) ;
    std::printf("    Temperature    : %f Celsius\n", inputs.AsDouble("temperature")) ;
    std::printf("    Relative Humid.: %f\n", inputs.AsDouble("humidity")) ;
    std::printf("\n") ;
}